

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::AnimatedPerspectiveCameraNode
          (AnimatedPerspectiveCameraNode *this,
          vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
          *cameras,BBox1f time_range,string *id)

{
  undefined1 auVar1 [16];
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  allocator local_49;
  undefined1 local_48 [16];
  string local_30;
  
  local_48._8_4_ = in_XMM0_Dc;
  local_48._0_8_ = time_range;
  local_48._12_4_ = in_XMM0_Dd;
  std::__cxx11::string::string((string *)&local_30,"",&local_49);
  PerspectiveCameraNode::PerspectiveCameraNode(&this->super_PerspectiveCameraNode,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  auVar1 = local_48;
  (this->super_PerspectiveCameraNode).super_Node.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR__AnimatedPerspectiveCameraNode_002a4528;
  (this->time_range).lower = (float)local_48._0_4_;
  (this->time_range).upper = (float)local_48._4_4_;
  local_48 = auVar1;
  std::
  vector<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
  ::vector(&this->cameras,cameras);
  return;
}

Assistant:

AnimatedPerspectiveCameraNode (std::vector<Ref<PerspectiveCameraNode>>&& cameras, BBox1f time_range, const std::string& id = "")
        : time_range(time_range), cameras(cameras) {}